

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O3

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
::ArrayMap(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
           *this,GraphType *graph)

{
  (this->super_ObserverBase)._notifier = (Notifier *)0x0;
  (this->super_ObserverBase)._index._M_node = (_List_node_base *)0x0;
  (this->super_ObserverBase)._vptr_ObserverBase = (_func_int **)&PTR__ArrayMap_0016f458;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::attach(&graph->node_notifier,&this->super_ObserverBase);
  allocate_memory(this);
  return;
}

Assistant:

explicit ArrayMap(const GraphType& graph) {
    Parent::attach(graph.notifier(Item()));
    allocate_memory();
    Notifier* nf = Parent::notifier();
    Item      it;
    for (nf->first(it); it != INVALID; nf->next(it)) {
      int id = nf->id(it);
      ;
      AllocatorTraits::construct(allocator, &(values[id]), Value());
    }
  }